

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRhs(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *newRhs,bool scale)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  double *pdVar8;
  undefined7 in_register_00000009;
  cpp_dec_float<50U,_int,_void> local_98;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  undefined8 local_38;
  int local_30;
  undefined1 local_2c;
  undefined8 local_28;
  
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    ::soplex::infinity::__tls_init();
    pdVar8 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_98.fpclass = cpp_dec_float_finite;
    local_98.prec_elem = 10;
    local_98.data._M_elems[0] = 0;
    local_98.data._M_elems[1] = 0;
    local_98.data._M_elems[2] = 0;
    local_98.data._M_elems[3] = 0;
    local_98.data._M_elems[4] = 0;
    local_98.data._M_elems[5] = 0;
    local_98.data._M_elems._24_5_ = 0;
    local_98.data._M_elems[7]._1_3_ = 0;
    local_98.data._M_elems._32_5_ = 0;
    local_98._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_98,*pdVar8);
    if ((((newRhs->m_backend).fpclass != cpp_dec_float_NaN) &&
        (local_98.fpclass != cpp_dec_float_NaN)) &&
       (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&newRhs->m_backend,&local_98), iVar7 < 0)) {
      local_38 = *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
      local_58 = (newRhs->m_backend).data._M_elems[0];
      uStack_54 = (newRhs->m_backend).data._M_elems[1];
      uStack_50 = (newRhs->m_backend).data._M_elems[2];
      uStack_4c = (newRhs->m_backend).data._M_elems[3];
      local_48 = (newRhs->m_backend).data._M_elems[4];
      uStack_44 = (newRhs->m_backend).data._M_elems[5];
      uStack_40 = (newRhs->m_backend).data._M_elems[6];
      uStack_3c = (newRhs->m_backend).data._M_elems[7];
      local_30 = (newRhs->m_backend).exp;
      local_2c = (newRhs->m_backend).neg;
      local_28._0_4_ = (newRhs->m_backend).fpclass;
      local_28._4_4_ = (newRhs->m_backend).prec_elem;
      (*this->lp_scaler->_vptr_SPxScaler[0x2e])(&local_98,this->lp_scaler,this,i);
      newRhs = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_98;
    }
  }
  pnVar2 = (this->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar2[i].m_backend.data._M_elems + 8) =
       *(undefined8 *)((newRhs->m_backend).data._M_elems + 8);
  uVar3 = *(undefined8 *)(newRhs->m_backend).data._M_elems;
  uVar4 = *(undefined8 *)((newRhs->m_backend).data._M_elems + 2);
  uVar5 = *(undefined8 *)((newRhs->m_backend).data._M_elems + 6);
  puVar1 = pnVar2[i].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = *(undefined8 *)((newRhs->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar5;
  *(undefined8 *)&pnVar2[i].m_backend.data = uVar3;
  *(undefined8 *)(pnVar2[i].m_backend.data._M_elems + 2) = uVar4;
  pnVar2[i].m_backend.exp = (newRhs->m_backend).exp;
  pnVar2[i].m_backend.neg = (newRhs->m_backend).neg;
  iVar6 = (newRhs->m_backend).prec_elem;
  pnVar2[i].m_backend.fpclass = (newRhs->m_backend).fpclass;
  pnVar2[i].m_backend.prec_elem = iVar6;
  return;
}

Assistant:

virtual void changeRhs(int i, const R& newRhs, bool scale = false)
   {
      if(scale && newRhs < R(infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::rhs_w(i) = lp_scaler->scaleRhs(*this, i, newRhs);
      }
      else
         LPRowSetBase<R>::rhs_w(i) = newRhs;

      assert(isConsistent());
   }